

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
::
binary_search_impl<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           *this,string_view *k,ulong s,ulong e,StringBtreeDefaultLess *comp)

{
  weak_ordering wVar1;
  template_ElementType<3UL> *ptVar2;
  ulong extraout_RDX;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  SearchResult<unsigned_long,_true> SVar6;
  string_view lhs;
  
  uVar5 = s;
  do {
    while( true ) {
      if (uVar5 == e) {
        uVar3 = CONCAT71((int7)(s >> 8),1);
        goto LAB_001cfb7c;
      }
      uVar4 = e + uVar5 >> 1;
      ptVar2 = GetField<3ul>(this);
      lhs._M_str = *(char **)((long)ptVar2 + uVar4 * 0x18 + 8);
      lhs._M_len = ptVar2[uVar4].value.first._M_len;
      wVar1 = StringBtreeDefaultLess::operator()(comp,lhs,*k);
      s = extraout_RDX;
      if (-1 < wVar1.value_) break;
      uVar5 = uVar4 + 1;
    }
    e = uVar4;
  } while (wVar1.value_ != '\0');
  uVar3 = 0;
LAB_001cfb7c:
  SVar6._8_8_ = uVar3;
  SVar6.value = e;
  return SVar6;
}

Assistant:

SearchResult<size_type, true> binary_search_impl(
      const K &k, size_type s, size_type e, const CompareTo &comp,
      std::true_type /* IsCompareTo */) const {
    if (params_type::template can_have_multiple_equivalent_keys<K>()) {
      MatchKind exact_match = MatchKind::kNe;
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else {
          e = mid;
          if (c == 0) {
            // Need to return the first value whose key is not less than k,
            // which requires continuing the binary search if there could be
            // multiple equivalent keys.
            exact_match = MatchKind::kEq;
          }
        }
      }
      return {s, exact_match};
    } else {  // Can't have multiple equivalent keys.
      while (s != e) {
        const size_type mid = (s + e) >> 1;
        const absl::weak_ordering c = comp(key(mid), k);
        if (c < 0) {
          s = mid + 1;
        } else if (c > 0) {
          e = mid;
        } else {
          return {mid, MatchKind::kEq};
        }
      }
      return {s, MatchKind::kNe};
    }
  }